

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

rrb<immutable::vector<char,_false,_6>,_true,_5> *
immutable::rrb_details::rrb_head_clone<immutable::vector<char,false,6>,true,5>
          (rrb<immutable::vector<char,_false,_6>,_true,_5> *original)

{
  rrb<immutable::vector<char,_false,_6>,_true,_5> *__dest;
  rrb<immutable::vector<char,_false,_6>,_true,_5> *clone;
  rrb<immutable::vector<char,_false,_6>,_true,_5> *original_local;
  
  __dest = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)malloc(0x28);
  memcpy(__dest,original,0x28);
  ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>::inc
            (&__dest->root);
  ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>::inc
            (&__dest->tail);
  return __dest;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_head_clone(const rrb<T, atomic_ref_counting, N>* original)
      {
      rrb<T, atomic_ref_counting, N>* clone = (rrb<T, atomic_ref_counting, N>*)malloc(sizeof(rrb<T, atomic_ref_counting, N>));
      memcpy(clone, original, sizeof(rrb<T, atomic_ref_counting, N>));
      clone->root.inc();
      clone->tail.inc();
      return clone;
      }